

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O0

Pubkey * cfd::core::SchnorrUtil::ComputeSigPointBatch
                   (Pubkey *__return_storage_ptr__,
                   vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *msgs,
                   vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>
                   *nonces,SchnorrPubkey *pubkey)

{
  initializer_list<cfd::core::Pubkey> __l;
  pointer puVar1;
  SchnorrPubkey *this;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  CfdException *this_00;
  const_reference pvVar5;
  pointer puVar6;
  const_reference data;
  Pubkey *local_4a8;
  allocator<cfd::core::Pubkey> local_441;
  Pubkey *local_440;
  Pubkey local_438;
  Pubkey local_420;
  undefined1 local_408 [40];
  ByteData local_3e0;
  ByteData256 local_3c8;
  ByteData local_3b0;
  allocator local_391;
  string local_390;
  ByteData local_370;
  ByteData local_358;
  Pubkey local_340;
  undefined1 local_328 [8];
  Pubkey xe;
  Privkey local_2f0;
  ByteData local_2d0;
  ByteData local_2b8;
  ByteData local_2a0;
  ByteData local_288;
  ByteData local_270;
  undefined1 local_258 [8];
  ByteData256 m_tagged_hash;
  size_t i;
  Privkey res;
  string local_210;
  undefined1 local_1f0 [8];
  ByteData bip340_challenge;
  ByteData local_1c0;
  allocator local_1a1;
  string local_1a0;
  ByteData local_180;
  ByteData local_168;
  Pubkey local_150;
  reference local_138;
  SchnorrPubkey *nonce;
  const_iterator __end3;
  const_iterator __begin3;
  vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_> *__range3;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pub_nonces;
  allocator local_e1;
  string local_e0;
  ByteData local_c0;
  ByteData local_a8;
  Pubkey local_90;
  undefined1 local_78 [8];
  Pubkey rs;
  allocator local_49;
  string local_48;
  SchnorrPubkey *local_28;
  SchnorrPubkey *pubkey_local;
  vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_> *nonces_local;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *msgs_local;
  
  local_28 = pubkey;
  pubkey_local = (SchnorrPubkey *)nonces;
  nonces_local = (vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_> *)msgs
  ;
  msgs_local = (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
               __return_storage_ptr__;
  sVar3 = ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::size(msgs)
  ;
  sVar4 = ::std::vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>::size
                    ((vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_> *)
                     pubkey_local);
  if (sVar3 == sVar4) {
    bVar2 = ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::empty
                      ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                       nonces_local);
    if (!bVar2) {
      Pubkey::Pubkey((Pubkey *)local_78);
      sVar3 = ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::size
                        ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                         nonces_local);
      if (sVar3 == 1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_e0,"02",&local_e1);
        ByteData::ByteData(&local_c0,&local_e0);
        pvVar5 = ::std::vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>
                 ::operator[]((vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>
                               *)pubkey_local,0);
        SchnorrPubkey::GetData
                  ((ByteData *)
                   &pub_nonces.
                    super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,pvVar5);
        ByteData::Concat<cfd::core::ByteData>
                  (&local_a8,&local_c0,
                   (ByteData *)
                   &pub_nonces.
                    super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        Pubkey::Pubkey(&local_90,&local_a8);
        Pubkey::operator=((Pubkey *)local_78,&local_90);
        Pubkey::~Pubkey(&local_90);
        ByteData::~ByteData(&local_a8);
        ByteData::~ByteData((ByteData *)
                            &pub_nonces.
                             super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ByteData::~ByteData(&local_c0);
        ::std::__cxx11::string::~string((string *)&local_e0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_e1);
      }
      else {
        ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
                  ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&__range3);
        this = pubkey_local;
        __end3 = ::std::vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>
                 ::begin((vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>
                          *)pubkey_local);
        nonce = (SchnorrPubkey *)
                ::std::vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>::
                end((vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_> *)
                    this);
        while( true ) {
          bVar2 = __gnu_cxx::operator!=
                            (&__end3,(__normal_iterator<const_cfd::core::SchnorrPubkey_*,_std::vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>_>
                                      *)&nonce);
          if (!bVar2) break;
          local_138 = __gnu_cxx::
                      __normal_iterator<const_cfd::core::SchnorrPubkey_*,_std::vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>_>
                      ::operator*(&__end3);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_1a0,"02",&local_1a1);
          ByteData::ByteData(&local_180,&local_1a0);
          SchnorrPubkey::GetData(&local_1c0,local_138);
          ByteData::Concat<cfd::core::ByteData>(&local_168,&local_180,&local_1c0);
          Pubkey::Pubkey(&local_150,&local_168);
          ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::push_back
                    ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&__range3,
                     &local_150);
          Pubkey::~Pubkey(&local_150);
          ByteData::~ByteData(&local_168);
          ByteData::~ByteData(&local_1c0);
          ByteData::~ByteData(&local_180);
          ::std::__cxx11::string::~string((string *)&local_1a0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
          __gnu_cxx::
          __normal_iterator<const_cfd::core::SchnorrPubkey_*,_std::vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>_>
          ::operator++(&__end3);
        }
        Pubkey::CombinePubkey
                  ((Pubkey *)
                   &bip340_challenge.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                   (vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&__range3);
        Pubkey::operator=((Pubkey *)local_78,
                          (Pubkey *)
                          &bip340_challenge.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
        Pubkey::~Pubkey((Pubkey *)
                        &bip340_challenge.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
        ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
                  ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&__range3);
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_210,
                 "7bb52d7a9fef58323eb1bf7a407db382d2f3f2d81bb1224f49fe518f6d48d37c7bb52d7a9fef58323eb1bf7a407db382d2f3f2d81bb1224f49fe518f6d48d37c"
                 ,(allocator *)((long)&res.net_type_ + 3));
      ByteData::ByteData((ByteData *)local_1f0,&local_210);
      ::std::__cxx11::string::~string((string *)&local_210);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&res.net_type_ + 3));
      Privkey::Privkey((Privkey *)&i);
      m_tagged_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      while( true ) {
        puVar1 = m_tagged_hash.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        puVar6 = (pointer)::std::
                          vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
                          size((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                                *)nonces_local);
        if (puVar6 <= puVar1) break;
        pvVar5 = ::std::vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>
                 ::operator[]((vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>
                               *)pubkey_local,
                              (size_type)
                              m_tagged_hash.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
        SchnorrPubkey::GetData(&local_2b8,pvVar5);
        ByteData::Concat<cfd::core::ByteData>(&local_2a0,(ByteData *)local_1f0,&local_2b8);
        SchnorrPubkey::GetData(&local_2d0,local_28);
        ByteData::Concat<cfd::core::ByteData>(&local_288,&local_2a0,&local_2d0);
        data = ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
               operator[]((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *
                          )nonces_local,
                          (size_type)
                          m_tagged_hash.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
        ByteData::Concat<cfd::core::ByteData256>(&local_270,&local_288,data);
        HashUtil::Sha256((ByteData256 *)local_258,&local_270);
        ByteData::~ByteData(&local_270);
        ByteData::~ByteData(&local_288);
        ByteData::~ByteData(&local_2d0);
        ByteData::~ByteData(&local_2a0);
        ByteData::~ByteData(&local_2b8);
        if (m_tagged_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
          Privkey::Privkey(&local_2f0,(ByteData256 *)local_258,kMainnet,true);
          Privkey::operator=((Privkey *)&i,&local_2f0);
          Privkey::~Privkey(&local_2f0);
        }
        else {
          Privkey::CreateTweakAdd
                    ((Privkey *)
                     &xe.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(Privkey *)&i,
                     (ByteData256 *)local_258);
          Privkey::operator=((Privkey *)&i,
                             (Privkey *)
                             &xe.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
          Privkey::~Privkey((Privkey *)
                            &xe.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        ByteData256::~ByteData256((ByteData256 *)local_258);
        m_tagged_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             m_tagged_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage + 1;
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_390,"02",&local_391);
      ByteData::ByteData(&local_370,&local_390);
      SchnorrPubkey::GetData(&local_3b0,local_28);
      ByteData::Concat<cfd::core::ByteData>(&local_358,&local_370,&local_3b0);
      Pubkey::Pubkey(&local_340,&local_358);
      Privkey::GetData(&local_3e0,(Privkey *)&i);
      ByteData256::ByteData256(&local_3c8,&local_3e0);
      Pubkey::CreateTweakMul((Pubkey *)local_328,&local_340,&local_3c8);
      ByteData256::~ByteData256(&local_3c8);
      ByteData::~ByteData(&local_3e0);
      Pubkey::~Pubkey(&local_340);
      ByteData::~ByteData(&local_358);
      ByteData::~ByteData(&local_3b0);
      ByteData::~ByteData(&local_370);
      ::std::__cxx11::string::~string((string *)&local_390);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_391);
      local_440 = &local_438;
      Pubkey::Pubkey(local_440,(Pubkey *)local_78);
      local_440 = &local_420;
      Pubkey::Pubkey(local_440,(Pubkey *)local_328);
      local_408._0_8_ = &local_438;
      local_408._8_8_ = (pointer)0x2;
      ::std::allocator<cfd::core::Pubkey>::allocator(&local_441);
      __l._M_len = local_408._8_8_;
      __l._M_array = (iterator)local_408._0_8_;
      ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
                ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)(local_408 + 0x10)
                 ,__l,&local_441);
      Pubkey::CombinePubkey
                (__return_storage_ptr__,
                 (vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)(local_408 + 0x10)
                );
      ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
                ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)(local_408 + 0x10)
                );
      ::std::allocator<cfd::core::Pubkey>::~allocator(&local_441);
      local_4a8 = (Pubkey *)local_408;
      do {
        local_4a8 = local_4a8 + -1;
        Pubkey::~Pubkey(local_4a8);
      } while (local_4a8 != &local_438);
      Pubkey::~Pubkey((Pubkey *)local_328);
      Privkey::~Privkey((Privkey *)&i);
      ByteData::~ByteData((ByteData *)local_1f0);
      Pubkey::~Pubkey((Pubkey *)local_78);
      return __return_storage_ptr__;
    }
  }
  rs.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&local_48,
             "Expected same number of messages or nonces, and at least one message.",&local_49);
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_48);
  rs.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Pubkey SchnorrUtil::ComputeSigPointBatch(
    const std::vector<ByteData256> &msgs,
    const std::vector<SchnorrPubkey> &nonces, const SchnorrPubkey &pubkey) {
  if (msgs.size() != nonces.size() || msgs.empty()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Expected same number of messages or nonces, and at least one "
        "message.");
  }

  Pubkey rs;

  if (msgs.size() == 1) {
    rs = Pubkey(ByteData("02").Concat(nonces[0].GetData()));
  } else {
    std::vector<Pubkey> pub_nonces;
    for (const auto &nonce : nonces) {
      pub_nonces.push_back(Pubkey(ByteData("02").Concat(nonce.GetData())));
    }
    rs = Pubkey::CombinePubkey(pub_nonces);
  }

  auto bip340_challenge = ByteData(
      "7bb52d7a9fef58323eb1bf7a407db382d2f3f2d81bb1224f49fe518f6d48d37c7bb52d7"
      "a9fef58323eb1bf7a407db382d2f3f2d81bb1224f49fe518f6d48d37c");
  Privkey res;
  for (size_t i = 0; i < msgs.size(); i++) {
    auto m_tagged_hash =
        HashUtil::Sha256(bip340_challenge.Concat(nonces[i].GetData())
                             .Concat(pubkey.GetData())
                             .Concat(msgs[i]));
    if (i == 0) {
      res = Privkey(m_tagged_hash);
    } else {
      res = res.CreateTweakAdd(m_tagged_hash);
    }
  }

  auto xe = Pubkey(ByteData("02").Concat(pubkey.GetData()))
                .CreateTweakMul(ByteData256(res.GetData()));

  return Pubkey::CombinePubkey({rs, xe});
}